

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileTargetGenerator::~cmMakefileTargetGenerator(cmMakefileTargetGenerator *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

cmMakefileTargetGenerator::~cmMakefileTargetGenerator() = default;